

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O0

void gen_xsiexpdp(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 arg1;
  TCGv_i64 arg1_00;
  uint32_t uVar1;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 t0;
  TCGv_i64 rb;
  TCGv_i64 ra;
  TCGv_i64 xth;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = rA(ctx->opcode);
  arg1 = cpu_gpr[uVar1];
  uVar1 = rB(ctx->opcode);
  arg1_00 = cpu_gpr[uVar1];
  if (((ctx->vsx_enabled ^ 0xffU) & 1) == 0) {
    ret = tcg_temp_new_i64(tcg_ctx_00);
    ret_00 = tcg_temp_new_i64(tcg_ctx_00);
    tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret_00,arg1,-0x7ff0000000000001);
    tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret,arg1_00,0x7ff);
    tcg_gen_shli_i64_ppc64(tcg_ctx_00,ret,ret,0x34);
    tcg_gen_or_i64_ppc64(tcg_ctx_00,ret_00,ret_00,ret);
    uVar1 = xT(ctx->opcode);
    set_cpu_vsrh(tcg_ctx_00,uVar1,ret_00);
    tcg_temp_free_i64(tcg_ctx_00,ret);
    tcg_temp_free_i64(tcg_ctx_00,ret_00);
  }
  else {
    gen_exception(ctx,0x5e);
  }
  return;
}

Assistant:

static void gen_xsiexpdp(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 xth;
    TCGv ra = cpu_gpr[rA(ctx->opcode)];
    TCGv rb = cpu_gpr[rB(ctx->opcode)];
    TCGv_i64 t0;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    t0 = tcg_temp_new_i64(tcg_ctx);
    xth = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_andi_i64(tcg_ctx, xth, ra, 0x800FFFFFFFFFFFFF);
    tcg_gen_andi_i64(tcg_ctx, t0, rb, 0x7FF);
    tcg_gen_shli_i64(tcg_ctx, t0, t0, 52);
    tcg_gen_or_i64(tcg_ctx, xth, xth, t0);
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), xth);
    /* dword[1] is undefined */
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, xth);
}